

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tct3.cpp
# Opt level: O1

void __thiscall
CTPNSym::gen_code_new
          (CTPNSym *this,int discard,int argc,int varargs,CTcNamedArgs *named_args,int param_5,
          int is_transient)

{
  CTcPrsSymtab *this_00;
  int iVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  CTcSymbol *pCVar3;
  
  this_00 = G_cs->symtab_;
  iVar1 = (*(this->super_CTPNSymBase).super_CTcPrsNode.super_CTcPrsNodeBase._vptr_CTcPrsNodeBase
            [0xc])();
  iVar2 = (*(this->super_CTPNSymBase).super_CTcPrsNode.super_CTcPrsNodeBase._vptr_CTcPrsNodeBase
            [0xd])(this);
  pCVar3 = CTcPrsSymtab::find_or_def
                     (this_00,(textchar_t *)CONCAT44(extraout_var,iVar1),
                      CONCAT44(extraout_var_00,iVar2),0,TCPRS_UNDEF_ADD_UNDEF);
  (*(pCVar3->super_CTcSymbolBase).super_CVmHashEntryCS.super_CVmHashEntry._vptr_CVmHashEntry[0x1c])
            (pCVar3,(ulong)(uint)discard,(ulong)(uint)argc,(ulong)(uint)varargs,named_args,
             (ulong)(uint)is_transient);
  return;
}

Assistant:

void CTPNSym::gen_code_new(int discard, int argc, int varargs,
                           CTcNamedArgs *named_args,
                           int /*from_call*/, int is_transient)
{
    /*
     *   Look up our symbol, then ask the resulting symbol to generate the
     *   'new' code.  If the symbol is undefined, add an 'undefined' entry
     *   to the table; we can't implicitly create an object symbol. 
     */
    G_cs->get_symtab()
        ->find_or_def_undef(get_sym_text(), get_sym_text_len(), FALSE)
        ->gen_code_new(discard, argc, varargs, named_args, is_transient);
}